

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# append_and_prepend_subject.c
# Opt level: O1

void usage(void)

{
  putchar(10);
  puts("libcmime - simple api demonstration");
  puts("-----------------------------------");
  puts("demonstrates: append or prepend something to the subject string");
  puts("output: output is written to stdout if no output file is specified");
  puts("optional parameter: -a string to append ");
  puts("optional parameter: -p string to prepend");
  puts("optional parameter: -o /path/to/out_file");
  printf("\nexample: ./examples/append_and_prepend_subject -a \"aaa aaa aaa\" -p \"bbb bbb bbb\"");
  return;
}

Assistant:

void usage() {
    printf("\n");
    printf("libcmime - simple api demonstration\n");
    printf("-----------------------------------\n");
    printf("demonstrates: append or prepend something to the subject string\n");
    printf("output: output is written to stdout if no output file is specified\n");
    printf("optional parameter: -a string to append \n");
    printf("optional parameter: -p string to prepend\n");
    printf("optional parameter: -o /path/to/out_file\n");
    printf("\nexample: ./examples/append_and_prepend_subject -a \"aaa aaa aaa\" -p \"bbb bbb bbb\"");
}